

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_btype.cc
# Opt level: O2

void BuiltInType::static_init(void)

{
  Type *type;
  long lVar1;
  char **ppcVar2;
  allocator<char> local_49;
  string local_48;
  
  ppcVar2 = basic_pactype_name;
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,*ppcVar2,&local_49);
    type = (Type *)operator_new(400);
    BuiltInType((BuiltInType *)type,(BITType)lVar1);
    Type::AddPredefinedType(&local_48,type);
    std::__cxx11::string::~string((string *)&local_48);
    ppcVar2 = ppcVar2 + 1;
  }
  return;
}

Assistant:

void BuiltInType::static_init()
	{
	for ( int bit_type = 0; basic_pactype_name[bit_type]; ++bit_type )
		{
		Type::AddPredefinedType(basic_pactype_name[bit_type], new BuiltInType((BITType)bit_type));
		}
	}